

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O0

ClientMetric * __thiscall
prometheus::Summary::Collect(ClientMetric *__return_storage_ptr__,Summary *this)

{
  bool bVar1;
  size_type __n;
  undefined1 auStack_68 [8];
  Quantile metricQuantile;
  Quantile *quantile;
  const_iterator __end1;
  const_iterator __begin1;
  Quantiles *__range1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  Summary *this_local;
  ClientMetric *metric;
  
  lock._M_device._7_1_ = 0;
  (__return_storage_ptr__->untyped).value = 0.0;
  __return_storage_ptr__->timestamp_ms = 0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_sum = 0.0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_count = 0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->summary).sample_count = 0;
  (__return_storage_ptr__->summary).sample_sum = 0.0;
  (__return_storage_ptr__->gauge).value = 0.0;
  (__return_storage_ptr__->info).value = 0.0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->counter).value = 0.0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ClientMetric::ClientMetric(__return_storage_ptr__);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mutex_);
  __n = std::
        vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
        ::size(&this->quantiles_);
  std::
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>::
  reserve(&(__return_storage_ptr__->summary).quantile,__n);
  __end1 = std::
           vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
           ::begin(&this->quantiles_);
  quantile = (Quantile *)
             std::
             vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
             ::end(&this->quantiles_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_prometheus::detail::CKMSQuantiles::Quantile_*,_std::vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>_>
                                *)&quantile);
    if (!bVar1) break;
    metricQuantile.value =
         (double)__gnu_cxx::
                 __normal_iterator<const_prometheus::detail::CKMSQuantiles::Quantile_*,_std::vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>_>
                 ::operator*(&__end1);
    auStack_68 = (undefined1  [8])0x0;
    metricQuantile.quantile = 0.0;
    ClientMetric::Quantile::Quantile((Quantile *)auStack_68);
    auStack_68 = *(undefined1 (*) [8])metricQuantile.value;
    metricQuantile.quantile =
         detail::TimeWindowQuantiles::get(&this->quantile_values_,*(double *)metricQuantile.value);
    std::
    vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
    ::push_back(&(__return_storage_ptr__->summary).quantile,(value_type *)auStack_68);
    __gnu_cxx::
    __normal_iterator<const_prometheus::detail::CKMSQuantiles::Quantile_*,_std::vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>_>
    ::operator++(&__end1);
  }
  (__return_storage_ptr__->summary).sample_count = this->count_;
  (__return_storage_ptr__->summary).sample_sum = this->sum_;
  lock._M_device._7_1_ = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  if ((lock._M_device._7_1_ & 1) == 0) {
    ClientMetric::~ClientMetric(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ClientMetric Summary::Collect() const {
  auto metric = ClientMetric{};

  std::lock_guard<std::mutex> lock(mutex_);

  metric.summary.quantile.reserve(quantiles_.size());
  for (const auto& quantile : quantiles_) {
    auto metricQuantile = ClientMetric::Quantile{};
    metricQuantile.quantile = quantile.quantile;
    metricQuantile.value = quantile_values_.get(quantile.quantile);
    metric.summary.quantile.push_back(std::move(metricQuantile));
  }
  metric.summary.sample_count = count_;
  metric.summary.sample_sum = sum_;

  return metric;
}